

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Threading.cpp
# Opt level: O2

uint llvm::hardware_concurrency(void)

{
  int iVar1;
  
  iVar1 = std::thread::hardware_concurrency();
  return iVar1 + (uint)(iVar1 == 0);
}

Assistant:

unsigned llvm::hardware_concurrency() {
#if defined(HAVE_SCHED_GETAFFINITY) && defined(HAVE_CPU_COUNT)
  cpu_set_t Set;
  if (sched_getaffinity(0, sizeof(Set), &Set))
    return CPU_COUNT(&Set);
#endif
  // Guard against std::thread::hardware_concurrency() returning 0.
  if (unsigned Val = std::thread::hardware_concurrency())
    return Val;
  return 1;
}